

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveIncbin::CDirectiveIncbin(CDirectiveIncbin *this,ArgumentList *args)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Entry *pEVar4;
  int inputFileSize;
  wstring local_38 [32];
  ArgumentList *local_18;
  ArgumentList *args_local;
  CDirectiveIncbin *this_local;
  
  local_18 = args;
  args_local = (ArgumentList *)this;
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveIncbin_001f2c00;
  std::__cxx11::wstring::wstring((wstring *)&this->fileName);
  ArgumentList::operator[](local_18,0);
  getFullPathName(local_38);
  std::__cxx11::wstring::operator=((wstring *)&this->fileName,(wstring *)local_38);
  std::__cxx11::wstring::~wstring((wstring *)local_38);
  bVar1 = fileExists(&this->fileName);
  if (!bVar1) {
    Logger::printError<std::__cxx11::wstring>(FatalError,L"File %s not found",&this->fileName);
    return;
  }
  iVar2 = fileSize(&this->fileName);
  sVar3 = ArgumentList::size(local_18);
  if (sVar3 < 2) {
    this->startAddress = 0;
    this->loadSize = iVar2;
  }
  else {
    pEVar4 = ArgumentList::operator[](local_18,1);
    bVar1 = ConvertExpression(&pEVar4->text,&this->startAddress);
    if (!bVar1) {
      pEVar4 = ArgumentList::operator[](local_18,1);
      Logger::printError<std::__cxx11::wstring>
                (FatalError,L"Invalid start address %s",&pEVar4->text);
      return;
    }
    if (iVar2 <= this->startAddress) {
      Logger::printError<int>(Error,L"Start address 0x%08X after end of file",&this->startAddress);
      return;
    }
    sVar3 = ArgumentList::size(local_18);
    if (sVar3 < 3) {
      this->loadSize = iVar2 - this->startAddress;
    }
    else {
      pEVar4 = ArgumentList::operator[](local_18,2);
      bVar1 = ConvertExpression(&pEVar4->text,&this->loadSize);
      if (!bVar1) {
        pEVar4 = ArgumentList::operator[](local_18,1);
        Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid size %s",&pEVar4->text);
        return;
      }
      if (iVar2 < this->startAddress + this->loadSize) {
        Logger::printError<>(Warning,L"Loading beyond file end, truncating");
        this->loadSize = iVar2 - this->startAddress;
      }
    }
  }
  FileManager::advanceMemory(g_fileManager,(long)this->loadSize);
  return;
}

Assistant:

CDirectiveIncbin::CDirectiveIncbin(ArgumentList& args)
{
	fileName = getFullPathName(args[0].text);

	if (fileExists(fileName) == false)
	{
		Logger::printError(Logger::FatalError,L"File %s not found",fileName);
		return;
	}

	int inputFileSize = fileSize(fileName);
	if (args.size() >= 2)
	{
		// load start address
		if (ConvertExpression(args[1].text,startAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid start address %s",args[1].text);
			return;
		}

		if (startAddress >= inputFileSize)
		{
			Logger::printError(Logger::Error,L"Start address 0x%08X after end of file",startAddress);
			return;
		}

		if (args.size() >= 3)
		{
			// load size too
			if (ConvertExpression(args[2].text,loadSize) == false)
			{
				Logger::printError(Logger::FatalError,L"Invalid size %s",args[1].text);
				return;
			}

			if (startAddress+loadSize > inputFileSize)
			{
				Logger::printError(Logger::Warning,L"Loading beyond file end, truncating");
				loadSize =  inputFileSize-startAddress;
			}
		} else {
			loadSize =  inputFileSize-startAddress;
		}
	} else {
		startAddress = 0;
		loadSize = inputFileSize;
	}

	g_fileManager->advanceMemory(loadSize);
}